

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall cmGeneratorTarget::IsDeprecated(cmGeneratorTarget *this)

{
  cmValue cVar1;
  bool bVar2;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"DEPRECATION",&local_31);
  cVar1 = GetProperty(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (cVar1.Value == (string *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = (cVar1.Value)->_M_string_length != 0;
  }
  return bVar2;
}

Assistant:

bool cmGeneratorTarget::IsDeprecated() const
{
  cmValue deprecation = this->GetProperty("DEPRECATION");
  return cmNonempty(deprecation);
}